

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

DdNode * Cudd_addComputeCube(DdManager *dd,DdNode **vars,int *phase,int n)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *h;
  DdNode *g;
  DdNode *n_00;
  ulong uVar4;
  
  n_00 = dd->one;
  piVar1 = (int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  pDVar2 = dd->zero;
  uVar4 = (ulong)(uint)n;
  while( true ) {
    if ((int)uVar4 < 1) {
      piVar1 = (int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      return n_00;
    }
    if ((phase == (int *)0x0) || (phase[uVar4 - 1] != 0)) {
      pDVar3 = vars[uVar4 - 1];
      h = pDVar2;
      g = n_00;
    }
    else {
      pDVar3 = vars[uVar4 - 1];
      h = n_00;
      g = pDVar2;
    }
    pDVar3 = Cudd_addIte(dd,pDVar3,g,h);
    if (pDVar3 == (DdNode *)0x0) break;
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,n_00);
    uVar4 = uVar4 - 1;
    n_00 = pDVar3;
  }
  Cudd_RecursiveDeref(dd,n_00);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addComputeCube(
  DdManager * dd,
  DdNode ** vars,
  int * phase,
  int  n)
{
    DdNode      *cube, *zero;
    DdNode      *fn;
    int         i;

    cube = DD_ONE(dd);
    cuddRef(cube);
    zero = DD_ZERO(dd);

    for (i = n - 1; i >= 0; i--) {
        if (phase == NULL || phase[i] != 0) {
            fn = Cudd_addIte(dd,vars[i],cube,zero);
        } else {
            fn = Cudd_addIte(dd,vars[i],zero,cube);
        }
        if (fn == NULL) {
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(fn);
        Cudd_RecursiveDeref(dd,cube);
        cube = fn;
    }
    cuddDeref(cube);

    return(cube);

}